

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstdarg_test.cpp
# Opt level: O0

pint p_test_case_pstdarg_general_test(void)

{
  pint pVar1;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  pint32_var[0] = -0x80000000;
  pint32_var[1] = 0x7fff0000;
  puint32_var[1] = 0xffff0000;
  pint64_var[0] = -0x8000000000000000;
  pint64_var[1] = 0x7fff000000000000;
  puint64_var[1] = 0xffff000000000000;
  variadic_function(0,0xbff3be76c0000000,-1.567,1.567,0x3ff3be76c0000000,0xffffff80,0,0xffff8000,0,
                    0x80000000,puint32_var[0],0x8000000000000000,puint64_var[0],0x80000000,0,
                    0xffff8000,-0x8000000000000000,0,(ppointer)0x0,p_libsys_init,0x7a,
                    0x7fffffffffffffff,0x7fff,0xffffffff,0x7fffffff,0xffff000000000000,
                    0x7fff000000000000,0xffff0000,0x7fff0000,0xffff,0x7fff,0xff,0x7f);
  p_libsys_shutdown();
  pVar1 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar1 = 0;
  }
  return pVar1;
}

Assistant:

P_TEST_CASE_BEGIN (pstdarg_general_test)
{
	p_libsys_init ();

	pint32_var[0] = P_MININT16;
	pint32_var[0] <<= 16;
	pint32_var[1] = P_MAXINT16;
	pint32_var[1] <<= 16;
	puint32_var[1] = P_MAXUINT16;
	puint32_var[1] <<= 16;

	pint64_var[0] = pint32_var[0];
	pint64_var[0] <<= 32;
	pint64_var[1] = pint32_var[1];
	pint64_var[1] <<= 32;
	puint64_var[1] = puint32_var[1];
	puint64_var[1] <<= 32;

	variadic_function (0,
			   pint8_var[0],
			   puint8_var[0],
			   pint16_var[0],
			   puint16_var[0],
			   pint32_var[0],
			   puint32_var[0],
			   pint64_var[0],
			   puint64_var[0],
			   pint_var[0],
			   puint_var[0],
			   pshort_var[0],
			   plong_var[0],
			   pchar_var[0],
			   ppointer_var[0],
			   pfloat_var[0],
			   pdouble_var[0],
			   /* Cut is here when testing p_va_copy, we stack in reverse order */
			   pdouble_var[1],
			   pfloat_var[1],
			   ppointer_var[1],
			   pchar_var[1],
			   plong_var[1],
			   pshort_var[1],
			   puint_var[1],
			   pint_var[1],
			   puint64_var[1],
			   pint64_var[1],
			   puint32_var[1],
			   pint32_var[1],
			   puint16_var[1],
			   pint16_var[1],
			   puint8_var[1],
			   pint8_var[1]);

	p_libsys_shutdown ();
}